

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertCstrNoCaseEqual
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  bool bVar1;
  TestResult *pTVar2;
  SimpleString local_b8;
  char *local_a8;
  size_t local_a0;
  TestFailure local_98;
  
  local_a8 = fileName;
  local_a0 = lineNumber;
  pTVar2 = getTestResult(this);
  (*pTVar2->_vptr_TestResult[10])(pTVar2);
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if (expected == (char *)0x0 || actual == (char *)0x0) {
      SimpleString::SimpleString(&local_b8,text);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                ((StringEqualNoCaseFailure *)&local_98,this,local_a8,local_a0,expected,actual,
                 &local_b8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_b8);
    }
    SimpleString::SimpleString((SimpleString *)&local_98,expected);
    SimpleString::SimpleString(&local_b8,actual);
    bVar1 = SimpleString::equalsNoCase((SimpleString *)&local_98,&local_b8);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString((SimpleString *)&local_98);
    if (!bVar1) {
      SimpleString::SimpleString(&local_b8,text);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                ((StringEqualNoCaseFailure *)&local_98,this,local_a8,local_a0,expected,actual,
                 &local_b8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_b8);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseEqual(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(expected).equalsNoCase(actual))
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
}